

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  char *pcVar1;
  int iVar2;
  LogDestination *this;
  Mutex *pMVar3;
  MutexLock l;
  MutexLock local_58;
  undefined4 local_50;
  LogSeverity local_4c;
  MutexLock local_48;
  LogMessageFatal local_40;
  
  local_58.mu_ = local_58.mu_ & 0xffffffff00000000;
  local_40.super_LogMessage.allocated_._0_4_ = severity;
  if (severity < 0) {
    pMVar3 = (Mutex *)MakeCheckOpString<int,int>((int *)&local_40,(int *)&local_58,"severity >= 0");
    if (pMVar3 != (Mutex *)0x0) {
      local_58.mu_ = pMVar3;
      LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x262,(CheckOpString *)&local_58);
      LogMessageFatal::~LogMessageFatal(&local_40);
    }
  }
  else {
    local_50 = 4;
    local_4c = severity;
    if (3 < (uint)severity) {
      SetLogSymlink();
    }
  }
  local_48.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar2 != 0) goto LAB_001152a6;
  }
  if (3 < (uint)severity) {
    __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                  ,0x32d,
                  "static LogDestination *google::LogDestination::log_destination(LogSeverity)");
  }
  this = (LogDestination *)(&log_destinations_)[(uint)severity];
  if (this == (LogDestination *)0x0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[(uint)severity] = this;
  }
  local_58.mu_ = &(this->fileobject_).lock_;
  if ((this->fileobject_).lock_.is_safe_ == true) {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_58.mu_);
    if (iVar2 != 0) {
LAB_001152a6:
      abort();
    }
  }
  pcVar1 = (char *)(this->fileobject_).symlink_basename_._M_string_length;
  strlen(symlink_basename);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->fileobject_).symlink_basename_,0,pcVar1,(ulong)symlink_basename);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_58);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_48);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}